

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O2

unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> __thiscall
KDIS::UTILS::PDU_Factory::Decode(PDU_Factory *this,Header *H,KDataStream *Stream)

{
  KBOOL KVar1;
  PDUType PVar2;
  Entity_State_PDU *this_00;
  IO_Report_PDU *this_01;
  Create_Entity_R_PDU *this_02;
  Linear_Object_State_PDU *this_03;
  Entity_State_Update_PDU *this_04;
  Attribute_PDU *this_05;
  Minefield_Query_PDU *this_06;
  Stop_Freeze_R_PDU *this_07;
  Articulated_Parts_PDU *this_08;
  Action_Response_R_PDU *this_09;
  IsPartOf_PDU *this_10;
  Minefield_State_PDU *this_11;
  IO_Action_PDU *this_12;
  IFF_PDU *this_13;
  Transfer_Control_Request_PDU *this_14;
  Action_Response_PDU *this_15;
  Directed_Energy_Fire_PDU *this_16;
  Areal_Object_State_PDU *this_17;
  Acknowledge_PDU *this_18;
  IsGroupOf_PDU *this_19;
  LE_Fire_PDU *this_20;
  Set_Data_R_PDU *this_21;
  Remove_Entity_PDU *this_22;
  LE_Detonation_PDU *this_23;
  Service_Request_PDU *this_24;
  Environmental_Process_PDU *this_25;
  Event_Report_R_PDU *this_26;
  Record_Query_R_PDU *this_27;
  Start_Resume_PDU *this_28;
  Repair_Response_PDU *this_29;
  Signal_PDU *this_30;
  Transmitter_PDU *this_31;
  Detonation_PDU *this_32;
  Action_Request_PDU *this_33;
  Set_Record_R_PDU *this_34;
  Collision_PDU *this_35;
  Resupply_Cancel_PDU *this_36;
  Fire_PDU *this_37;
  Intercom_Control_PDU *this_38;
  Data_Query_PDU *this_39;
  Gridded_Data_PDU *this_40;
  Event_Report_PDU *this_41;
  Comment_R_PDU *this_42;
  Resupply_Offer_PDU *this_43;
  Collision_Elastic_PDU *this_44;
  Record_R_PDU *this_45;
  Comment_PDU *this_46;
  Stop_Freeze_PDU *this_47;
  Resupply_Received_PDU *this_48;
  Set_Data_PDU *this_49;
  Create_Entity_PDU *this_50;
  Repair_Complete_PDU *this_51;
  Intercom_Signal_PDU *this_52;
  Aggregate_State_PDU *this_53;
  TSPI_PDU *this_54;
  Electromagnetic_Emission_PDU *this_55;
  Minefield_Response_NACK_PDU *this_56;
  Data_PDU *this_57;
  Data_Query_R_PDU *this_58;
  Point_Object_State_PDU *this_59;
  Data_R_PDU *this_60;
  Designator_PDU *this_61;
  Underwater_Acoustic_PDU *this_62;
  SEES_PDU *this_63;
  Minefield_Data_PDU *this_64;
  Receiver_PDU *this_65;
  Acknowledge_R_PDU *this_66;
  Action_Request_R_PDU *this_67;
  Start_Resume_R_PDU *this_68;
  Appearance_PDU *this_69;
  Remove_Entity_R_PDU *this_70;
  Entity_Damage_Status_PDU *this_71;
  KDataStream *in_RCX;
  
  KVar1 = applyFiltersBeforeDecodingPDUBody((PDU_Factory *)H,(Header *)Stream);
  if (KVar1) {
    PVar2 = PDU::Header6::GetPDUType((Header6 *)Stream);
    switch(PVar2) {
    case Entity_State_PDU_Type:
      this_00 = (Entity_State_PDU *)operator_new(0x150);
      PDU::Entity_State_PDU::Entity_State_PDU(this_00,(Header *)Stream,in_RCX);
      break;
    case Fire_PDU_Type:
      this_37 = (Fire_PDU *)operator_new(200);
      PDU::Fire_PDU::Fire_PDU(this_37,(Header *)Stream,in_RCX);
      break;
    case Detonation_PDU_Type:
      this_32 = (Detonation_PDU *)operator_new(0xf0);
      PDU::Detonation_PDU::Detonation_PDU(this_32,(Header *)Stream,in_RCX);
      break;
    case Collision_PDU_Type:
      this_35 = (Collision_PDU *)operator_new(0x98);
      PDU::Collision_PDU::Collision_PDU(this_35,(Header *)Stream,in_RCX);
      break;
    case Service_Request_PDU_Type:
      this_24 = (Service_Request_PDU *)operator_new(0x70);
      PDU::Service_Request_PDU::Service_Request_PDU(this_24,(Header *)Stream,in_RCX);
      break;
    case Resupply_Offer_PDU_Type:
      this_43 = (Resupply_Offer_PDU *)operator_new(0x68);
      PDU::Resupply_Offer_PDU::Resupply_Offer_PDU(this_43,(Header *)Stream,in_RCX);
      break;
    case Resupply_Received_PDU_Type:
      this_48 = (Resupply_Received_PDU *)operator_new(0x68);
      PDU::Resupply_Received_PDU::Resupply_Received_PDU(this_48,(Header *)Stream,in_RCX);
      break;
    case Resupply_Cancel_PDU_Type:
      this_36 = (Resupply_Cancel_PDU *)operator_new(0x48);
      PDU::Resupply_Cancel_PDU::Resupply_Cancel_PDU(this_36,(Header *)Stream,in_RCX);
      break;
    case Repair_Complete_PDU_Type:
      this_51 = (Repair_Complete_PDU *)operator_new(0x50);
      PDU::Repair_Complete_PDU::Repair_Complete_PDU(this_51,(Header *)Stream,in_RCX);
      break;
    case Repair_Response_PDU_Type:
      this_29 = (Repair_Response_PDU *)operator_new(0x50);
      PDU::Repair_Response_PDU::Repair_Response_PDU(this_29,(Header *)Stream,in_RCX);
      break;
    case Create_Entity_PDU_Type:
      this_50 = (Create_Entity_PDU *)operator_new(0x50);
      PDU::Create_Entity_PDU::Create_Entity_PDU(this_50,(Header *)Stream,in_RCX);
      break;
    case Remove_Entity_PDU_Type:
      this_22 = (Remove_Entity_PDU *)operator_new(0x50);
      PDU::Remove_Entity_PDU::Remove_Entity_PDU(this_22,(Header *)Stream,in_RCX);
      break;
    case Start_Resume_PDU_Type:
      this_28 = (Start_Resume_PDU *)operator_new(0x70);
      PDU::Start_Resume_PDU::Start_Resume_PDU(this_28,(Header *)Stream,in_RCX);
      break;
    case Stop_Freeze_PDU_Type:
      this_47 = (Stop_Freeze_PDU *)operator_new(0x60);
      PDU::Stop_Freeze_PDU::Stop_Freeze_PDU(this_47,(Header *)Stream,in_RCX);
      break;
    case Acknowledge_PDU_Type:
      this_18 = (Acknowledge_PDU *)operator_new(0x50);
      PDU::Acknowledge_PDU::Acknowledge_PDU(this_18,(Header *)Stream,in_RCX);
      break;
    case Action_Request_PDU_Type:
      this_33 = (Action_Request_PDU *)operator_new(0x90);
      PDU::Action_Request_PDU::Action_Request_PDU(this_33,(Header *)Stream,in_RCX);
      break;
    case Action_Response_PDU_Type:
      this_15 = (Action_Response_PDU *)operator_new(0x90);
      PDU::Action_Response_PDU::Action_Response_PDU(this_15,(Header *)Stream,in_RCX);
      break;
    case Data_Query_PDU_Type:
      this_39 = (Data_Query_PDU *)operator_new(0x98);
      PDU::Data_Query_PDU::Data_Query_PDU(this_39,(Header *)Stream,in_RCX);
      break;
    case Set_Data_PDU_Type:
      this_49 = (Set_Data_PDU *)operator_new(0x88);
      PDU::Set_Data_PDU::Set_Data_PDU(this_49,(Header *)Stream,in_RCX);
      break;
    case Data_PDU_Type:
      this_57 = (Data_PDU *)operator_new(0x88);
      PDU::Data_PDU::Data_PDU(this_57,(Header *)Stream,in_RCX);
      break;
    case Event_Report_PDU_Type:
      this_41 = (Event_Report_PDU *)operator_new(0x88);
      PDU::Event_Report_PDU::Event_Report_PDU(this_41,(Header *)Stream,in_RCX);
      break;
    case Message_PDU_Type:
      this_46 = (Comment_PDU *)operator_new(0x80);
      PDU::Comment_PDU::Comment_PDU(this_46,(Header *)Stream,in_RCX);
      break;
    case Electromagnetic_Emission_PDU_Type:
      this_55 = (Electromagnetic_Emission_PDU *)operator_new(0x68);
      PDU::Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU
                (this_55,(Header *)Stream,in_RCX);
      break;
    case Designator_PDU_Type:
      this_61 = (Designator_PDU *)operator_new(0xb8);
      PDU::Designator_PDU::Designator_PDU(this_61,(Header *)Stream,in_RCX);
      break;
    case Transmitter_PDU_Type:
      this_31 = (Transmitter_PDU *)operator_new(0x108);
      PDU::Transmitter_PDU::Transmitter_PDU(this_31,(Header *)Stream,in_RCX);
      break;
    case Signal_PDU_Type:
      this_30 = (Signal_PDU *)operator_new(0x70);
      PDU::Signal_PDU::Signal_PDU(this_30,(Header *)Stream,in_RCX);
      break;
    case Receiver_PDU_Type:
      this_65 = (Receiver_PDU *)operator_new(0x60);
      PDU::Receiver_PDU::Receiver_PDU(this_65,(Header *)Stream,in_RCX);
      break;
    case IFF_ATC_NAVAIDS_PDU_Type:
      this_13 = (IFF_PDU *)operator_new(0xa8);
      PDU::IFF_PDU::IFF_PDU(this_13,(Header *)Stream,in_RCX);
      break;
    case UnderwaterAcoustic_PDU_Type:
      this_62 = (Underwater_Acoustic_PDU *)operator_new(0x98);
      PDU::Underwater_Acoustic_PDU::Underwater_Acoustic_PDU(this_62,(Header *)Stream,in_RCX);
      break;
    case SupplementalEmission_EntityState_PDU_Type:
      this_63 = (SEES_PDU *)operator_new(0x78);
      PDU::SEES_PDU::SEES_PDU(this_63,(Header *)Stream,in_RCX);
      break;
    case IntercomSignal_PDU_Type:
      this_52 = (Intercom_Signal_PDU *)operator_new(0x70);
      PDU::Intercom_Signal_PDU::Intercom_Signal_PDU(this_52,(Header *)Stream,in_RCX);
      break;
    case IntercomControl_PDU_Type:
      this_38 = (Intercom_Control_PDU *)operator_new(0x80);
      PDU::Intercom_Control_PDU::Intercom_Control_PDU(this_38,(Header *)Stream,in_RCX);
      break;
    case AggregateState_PDU_Type:
      this_53 = (Aggregate_State_PDU *)operator_new(0x180);
      PDU::Aggregate_State_PDU::Aggregate_State_PDU(this_53,(Header *)Stream,in_RCX);
      break;
    case IsGroupOf_PDU_Type:
      this_19 = (IsGroupOf_PDU *)operator_new(0x68);
      PDU::IsGroupOf_PDU::IsGroupOf_PDU(this_19,(Header *)Stream,in_RCX);
      break;
    case TransferControl_PDU_Type:
      this_14 = (Transfer_Control_Request_PDU *)operator_new(0x80);
      PDU::Transfer_Control_Request_PDU::Transfer_Control_Request_PDU
                (this_14,(Header *)Stream,in_RCX);
      break;
    case IsPartOf_PDU_Type:
      this_10 = (IsPartOf_PDU *)operator_new(0x90);
      PDU::IsPartOf_PDU::IsPartOf_PDU(this_10,(Header *)Stream,in_RCX);
      break;
    case MinefieldState_PDU_Type:
      this_11 = (Minefield_State_PDU *)operator_new(0xd8);
      PDU::Minefield_State_PDU::Minefield_State_PDU(this_11,(Header *)Stream,in_RCX);
      break;
    case MinefieldQuery_PDU_Type:
      this_06 = (Minefield_Query_PDU *)operator_new(0xa8);
      PDU::Minefield_Query_PDU::Minefield_Query_PDU(this_06,(Header *)Stream,in_RCX);
      break;
    case MinefieldData_PDU_Type:
      this_64 = (Minefield_Data_PDU *)operator_new(0xa0);
      PDU::Minefield_Data_PDU::Minefield_Data_PDU(this_64,(Header *)Stream,in_RCX);
      break;
    case MinefieldResponseNAK_PDU_Type:
      this_56 = (Minefield_Response_NACK_PDU *)operator_new(0x68);
      PDU::Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU(this_56,(Header *)Stream,in_RCX)
      ;
      break;
    case EnvironmentalProcess_PDU_Type:
      this_25 = (Environmental_Process_PDU *)operator_new(0x68);
      PDU::Environmental_Process_PDU::Environmental_Process_PDU(this_25,(Header *)Stream,in_RCX);
      break;
    case GriddedData_PDU_Type:
      this_40 = (Gridded_Data_PDU *)operator_new(0xb8);
      PDU::Gridded_Data_PDU::Gridded_Data_PDU(this_40,(Header *)Stream,in_RCX);
      break;
    case PointObjectState_PDU_Type:
      this_59 = (Point_Object_State_PDU *)operator_new(0xd8);
      PDU::Point_Object_State_PDU::Point_Object_State_PDU(this_59,(Header *)Stream,in_RCX);
      break;
    case LinearObjectState_PDU_Type:
      this_03 = (Linear_Object_State_PDU *)operator_new(0x98);
      PDU::Linear_Object_State_PDU::Linear_Object_State_PDU(this_03,(Header *)Stream,in_RCX);
      break;
    case ArealObjectState_PDU_Type:
      this_17 = (Areal_Object_State_PDU *)operator_new(0xb0);
      PDU::Areal_Object_State_PDU::Areal_Object_State_PDU(this_17,(Header *)Stream,in_RCX);
      break;
    case TSPI_PDU_Type:
      this_54 = (TSPI_PDU *)operator_new(0x200);
      PDU::TSPI_PDU::TSPI_PDU(this_54,(Header *)Stream,in_RCX);
      break;
    case Appearance_PDU_Type:
      this_69 = (Appearance_PDU *)operator_new(200);
      PDU::Appearance_PDU::Appearance_PDU(this_69,(Header *)Stream,in_RCX);
      break;
    case ArticulatedParts_PDU_Type:
      this_08 = (Articulated_Parts_PDU *)operator_new(0x58);
      PDU::Articulated_Parts_PDU::Articulated_Parts_PDU(this_08,(Header *)Stream,in_RCX);
      break;
    case LEFire_PDU_Type:
      this_20 = (LE_Fire_PDU *)operator_new(0x110);
      PDU::LE_Fire_PDU::LE_Fire_PDU(this_20,(Header *)Stream,in_RCX);
      break;
    case LEDetonation_PDU_Type:
      this_23 = (LE_Detonation_PDU *)operator_new(0x180);
      PDU::LE_Detonation_PDU::LE_Detonation_PDU(this_23,(Header *)Stream,in_RCX);
      break;
    case CreateEntity_R_PDU_Type:
      this_02 = (Create_Entity_R_PDU *)operator_new(0x60);
      PDU::Create_Entity_R_PDU::Create_Entity_R_PDU(this_02,(Header *)Stream,in_RCX);
      break;
    case RemoveEntity_R_PDU_Type:
      this_70 = (Remove_Entity_R_PDU *)operator_new(0x60);
      PDU::Remove_Entity_R_PDU::Remove_Entity_R_PDU(this_70,(Header *)Stream,in_RCX);
      break;
    case Start_Resume_R_PDU_Type:
      this_68 = (Start_Resume_R_PDU *)operator_new(0x80);
      PDU::Start_Resume_R_PDU::Start_Resume_R_PDU(this_68,(Header *)Stream,in_RCX);
      break;
    case Stop_Freeze_R_PDU_Type:
      this_07 = (Stop_Freeze_R_PDU *)operator_new(0x70);
      PDU::Stop_Freeze_R_PDU::Stop_Freeze_R_PDU(this_07,(Header *)Stream,in_RCX);
      break;
    case Acknowledge_R_PDU_Type:
      this_66 = (Acknowledge_R_PDU *)operator_new(0x50);
      PDU::Acknowledge_R_PDU::Acknowledge_R_PDU(this_66,(Header *)Stream,in_RCX);
      break;
    case ActionRequest_R_PDU_Type:
      this_67 = (Action_Request_R_PDU *)operator_new(0xa0);
      PDU::Action_Request_R_PDU::Action_Request_R_PDU(this_67,(Header *)Stream,in_RCX);
      break;
    case ActionResponse_R_PDU_Type:
      this_09 = (Action_Response_R_PDU *)operator_new(0x90);
      PDU::Action_Response_R_PDU::Action_Response_R_PDU(this_09,(Header *)Stream,in_RCX);
      break;
    case DataQuery_R_PDU_Type:
      this_58 = (Data_Query_R_PDU *)operator_new(0xa8);
      PDU::Data_Query_R_PDU::Data_Query_R_PDU(this_58,(Header *)Stream,in_RCX);
      break;
    case SetData_R_PDU_Type:
      this_21 = (Set_Data_R_PDU *)operator_new(0x98);
      PDU::Set_Data_R_PDU::Set_Data_R_PDU(this_21,(Header *)Stream,in_RCX);
      break;
    case Data_R_PDU_Type:
      this_60 = (Data_R_PDU *)operator_new(0x98);
      PDU::Data_R_PDU::Data_R_PDU(this_60,(Header *)Stream,in_RCX);
      break;
    case EventReport_R_PDU_Type:
      this_26 = (Event_Report_R_PDU *)operator_new(0x88);
      PDU::Event_Report_R_PDU::Event_Report_R_PDU(this_26,(Header *)Stream,in_RCX);
      break;
    case Comment_R_PDU_Type:
      this_42 = (Comment_R_PDU *)operator_new(0x80);
      PDU::Comment_R_PDU::Comment_R_PDU(this_42,(Header *)Stream,in_RCX);
      break;
    case Record_R_PDU_Type:
      this_45 = (Record_R_PDU *)operator_new(0x88);
      PDU::Record_R_PDU::Record_R_PDU(this_45,(Header *)Stream,in_RCX);
      break;
    case SetRecord_R_PDU_Type:
      this_34 = (Set_Record_R_PDU *)operator_new(0x80);
      PDU::Set_Record_R_PDU::Set_Record_R_PDU(this_34,(Header *)Stream,in_RCX);
      break;
    case RecordQuery_R_PDU_Type:
      this_27 = (Record_Query_R_PDU *)operator_new(0x80);
      PDU::Record_Query_R_PDU::Record_Query_R_PDU(this_27,(Header *)Stream,in_RCX);
      break;
    case Collision_Elastic_PDU_Type:
      this_44 = (Collision_Elastic_PDU *)operator_new(0xd0);
      PDU::Collision_Elastic_PDU::Collision_Elastic_PDU(this_44,(Header *)Stream,in_RCX);
      break;
    case EntityStateUpdate_PDU_Type:
      this_04 = (Entity_State_Update_PDU *)operator_new(0xb8);
      PDU::Entity_State_Update_PDU::Entity_State_Update_PDU(this_04,(Header *)Stream,in_RCX);
      break;
    case DirectedEnergyFire_PDU_Type:
      this_16 = (Directed_Energy_Fire_PDU *)operator_new(0xc0);
      PDU::Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU(this_16,(Header *)Stream,in_RCX);
      break;
    case EntityDamageStatus_PDU_Type:
      this_71 = (Entity_Damage_Status_PDU *)operator_new(0x58);
      PDU::Entity_Damage_Status_PDU::Entity_Damage_Status_PDU(this_71,(Header *)Stream,in_RCX);
      break;
    case IO_Action_PDU_Type:
      this_12 = (IO_Action_PDU *)operator_new(0x98);
      PDU::IO_Action_PDU::IO_Action_PDU(this_12,(Header *)Stream,in_RCX);
      break;
    case IO_Report_PDU_Type:
      this_01 = (IO_Report_PDU *)operator_new(0x80);
      PDU::IO_Report_PDU::IO_Report_PDU(this_01,(Header *)Stream,in_RCX);
      break;
    case Attribute_PDU_Type:
      this_05 = (Attribute_PDU *)operator_new(0x60);
      PDU::Attribute_PDU::Attribute_PDU(this_05,(Header *)Stream,in_RCX);
      break;
    default:
      goto switchD_001269c5_default;
    }
    applyFilters(this,H);
  }
  else {
switchD_001269c5_default:
    this->_vptr_PDU_Factory = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         this;
}

Assistant:

unique_ptr<Header> PDU_Factory::Decode(const Header &H, KDataStream &Stream) noexcept(false)
{
    if (!applyFiltersBeforeDecodingPDUBody(&H))
    {
        return unique_ptr<Header>();
    }

    switch( H.GetPDUType() )
    {
    case Entity_State_PDU_Type:
        return applyFilters( new Entity_State_PDU( H, Stream ) );

    case Fire_PDU_Type:
        return applyFilters( new Fire_PDU( H, Stream ) );

    case Detonation_PDU_Type:
        return applyFilters( new Detonation_PDU( H, Stream ) );

    case Collision_PDU_Type:
        return applyFilters( new Collision_PDU( H, Stream ) );

    case Service_Request_PDU_Type:
        return applyFilters( new Service_Request_PDU( H, Stream ) );

    case Resupply_Offer_PDU_Type:
        return applyFilters( new Resupply_Offer_PDU( H, Stream ) );

    case Resupply_Received_PDU_Type:
        return applyFilters( new Resupply_Received_PDU( H, Stream ) );

    case Resupply_Cancel_PDU_Type:
        return applyFilters( new Resupply_Cancel_PDU( H, Stream ) );

    case Repair_Complete_PDU_Type:
        return applyFilters( new Repair_Complete_PDU( H, Stream ) );

    case Repair_Response_PDU_Type:
        return applyFilters( new Repair_Response_PDU( H, Stream ) );

    case Create_Entity_PDU_Type:
        return applyFilters( new Create_Entity_PDU( H, Stream ) );

    case Remove_Entity_PDU_Type:
        return applyFilters( new Remove_Entity_PDU( H, Stream ) );

    case Start_Resume_PDU_Type:
        return applyFilters( new Start_Resume_PDU( H, Stream ) );

    case Stop_Freeze_PDU_Type:
        return applyFilters( new Stop_Freeze_PDU( H, Stream ) );

    case Acknowledge_PDU_Type:
        return applyFilters( new Acknowledge_PDU( H, Stream ) );

    case Action_Request_PDU_Type:
        return applyFilters( new Action_Request_PDU( H, Stream ) );

    case Action_Response_PDU_Type:
        return applyFilters( new Action_Response_PDU( H, Stream ) );

    case Data_Query_PDU_Type:
        return applyFilters( new Data_Query_PDU( H, Stream ) );

    case Set_Data_PDU_Type:
        return applyFilters( new Set_Data_PDU( H, Stream ) );

    case Data_PDU_Type:
        return applyFilters( new Data_PDU( H, Stream ) );

    case Event_Report_PDU_Type:
        return applyFilters( new Event_Report_PDU( H, Stream ) );

    case Message_PDU_Type:
        return applyFilters( new Comment_PDU( H, Stream ) );

    case Electromagnetic_Emission_PDU_Type:
        return applyFilters( new Electromagnetic_Emission_PDU( H, Stream ) );

    case Designator_PDU_Type:
        return applyFilters( new Designator_PDU( H, Stream ) );

    case Transmitter_PDU_Type:
        return applyFilters( new Transmitter_PDU( H, Stream ) );

    case Signal_PDU_Type:
        return applyFilters( new Signal_PDU( H, Stream ) );

    case Receiver_PDU_Type:
        return applyFilters( new Receiver_PDU( H, Stream ) );

// The following are DIS version 6 PDUs.
#if DIS_VERSION >= 6

    case Collision_Elastic_PDU_Type:
        return applyFilters( new Collision_Elastic_PDU( H, Stream ) );

    case IFF_ATC_NAVAIDS_PDU_Type:
            return applyFilters( new IFF_PDU( H, Stream ) );

    case UnderwaterAcoustic_PDU_Type:
        return applyFilters( new Underwater_Acoustic_PDU( H, Stream ) );

    case SupplementalEmission_EntityState_PDU_Type:
        return applyFilters( new SEES_PDU( H, Stream ) );

    case IntercomSignal_PDU_Type:
        return applyFilters( new Intercom_Signal_PDU( H, Stream ) );

    case IntercomControl_PDU_Type:
        return applyFilters( new Intercom_Control_PDU( H, Stream ) );

    case AggregateState_PDU_Type:
        return applyFilters( new Aggregate_State_PDU( H, Stream ) );

    case IsGroupOf_PDU_Type:
        return applyFilters( new IsGroupOf_PDU( H, Stream ) );

    case TransferControl_PDU_Type:
        return applyFilters( new Transfer_Control_Request_PDU( H, Stream ) );

    case IsPartOf_PDU_Type:
        return applyFilters( new IsPartOf_PDU( H, Stream ) );

    case MinefieldState_PDU_Type:
        return applyFilters( new Minefield_State_PDU( H, Stream ) );

    case MinefieldQuery_PDU_Type:
        return applyFilters( new Minefield_Query_PDU( H, Stream ) );

    case MinefieldData_PDU_Type:
        return applyFilters( new Minefield_Data_PDU( H, Stream ) );

    case MinefieldResponseNAK_PDU_Type:
        return applyFilters( new Minefield_Response_NACK_PDU( H, Stream ) );

    case EnvironmentalProcess_PDU_Type:
        return applyFilters( new Environmental_Process_PDU( H, Stream ) );

    case GriddedData_PDU_Type:
        return applyFilters( new Gridded_Data_PDU( H, Stream ) );

    case PointObjectState_PDU_Type:
        return applyFilters( new Point_Object_State_PDU( H, Stream ) );

    case LinearObjectState_PDU_Type:
        return applyFilters( new Linear_Object_State_PDU( H, Stream ) );

    case ArealObjectState_PDU_Type:
        return applyFilters( new Areal_Object_State_PDU( H, Stream ) );

    case TSPI_PDU_Type:
        return applyFilters( new TSPI_PDU( H, Stream ) );

    case Appearance_PDU_Type:
        return applyFilters( new Appearance_PDU( H, Stream ) );

    case ArticulatedParts_PDU_Type:
        return applyFilters( new Articulated_Parts_PDU( H, Stream ) );

    case LEFire_PDU_Type:
        return applyFilters( new LE_Fire_PDU( H, Stream ) );

    case LEDetonation_PDU_Type:
        return applyFilters( new LE_Detonation_PDU( H, Stream ) );

    case CreateEntity_R_PDU_Type:
        return applyFilters( new Create_Entity_R_PDU( H, Stream ) );

    case RemoveEntity_R_PDU_Type:
        return applyFilters( new Remove_Entity_R_PDU( H, Stream ) );

    case Start_Resume_R_PDU_Type:
        return applyFilters( new Start_Resume_R_PDU( H, Stream ) );

    case Stop_Freeze_R_PDU_Type:
        return applyFilters( new Stop_Freeze_R_PDU( H, Stream ) );

    case Acknowledge_R_PDU_Type:
        return applyFilters( new Acknowledge_R_PDU( H, Stream ) );

    case ActionRequest_R_PDU_Type:
        return applyFilters( new Action_Request_R_PDU( H, Stream ) );

    case ActionResponse_R_PDU_Type:
        return applyFilters( new Action_Response_R_PDU( H, Stream ) );

    case DataQuery_R_PDU_Type:
        return applyFilters( new Data_Query_R_PDU( H, Stream ) );

    case SetData_R_PDU_Type:
        return applyFilters( new Set_Data_R_PDU( H, Stream ) );

    case Data_R_PDU_Type:
        return applyFilters( new Data_R_PDU( H, Stream ) );

    case EventReport_R_PDU_Type:
        return applyFilters( new Event_Report_R_PDU( H, Stream ) );

    case Comment_R_PDU_Type:
        return applyFilters( new Comment_R_PDU( H, Stream ) );

    case Record_R_PDU_Type:
        return applyFilters( new Record_R_PDU( H, Stream ) );

    case SetRecord_R_PDU_Type:
        return applyFilters( new Set_Record_R_PDU( H, Stream ) );

    case RecordQuery_R_PDU_Type:
        return applyFilters( new Record_Query_R_PDU( H, Stream ) );

    case EntityStateUpdate_PDU_Type:
        return applyFilters( new Entity_State_Update_PDU( H, Stream ) );

    #endif

    // The following are DIS version 7 PDUs.
    #if DIS_VERSION >= 7

    case DirectedEnergyFire_PDU_Type:
        return applyFilters( new Directed_Energy_Fire_PDU( H, Stream ) );

    case EntityDamageStatus_PDU_Type:
        return applyFilters( new Entity_Damage_Status_PDU( H, Stream ) );

    case IO_Action_PDU_Type:
        return applyFilters( new IO_Action_PDU( H, Stream ) );

    case IO_Report_PDU_Type:
        return applyFilters( new IO_Report_PDU( H, Stream ) );

    case Attribute_PDU_Type:
        return applyFilters( new Attribute_PDU( H, Stream ) );

    #endif
    }

    // We could not decode the PDU
    return unique_ptr<Header>();
}